

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::SaveAlignmentChunkToBin
          (BamStandardIndex *this,BaiBinMap *binMap,uint32_t *currentBin,uint64_t *currentOffset,
          uint64_t *lastOffset)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  iterator __position;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  BaiAlignmentChunk newChunk;
  BaiAlignmentChunkVector newChunks;
  BaiAlignmentChunk local_58;
  vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
  local_48;
  pair<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
  local_30;
  
  local_58.Start = *currentOffset;
  local_58.Stop = *lastOffset;
  p_Var3 = (binMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(binMap->_M_t)._M_impl.super__Rb_tree_header;
    _Var2 = *currentBin;
    p_Var4 = &p_Var1->_M_header;
    do {
      bVar5 = p_Var3[1]._M_color < _Var2;
      if (!bVar5) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar5];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var4[1]._M_color <= _Var2)) {
      __position._M_current = (BaiAlignmentChunk *)p_Var4[1]._M_left;
      if ((_Base_ptr)__position._M_current != p_Var4[1]._M_right) {
        (__position._M_current)->Start = local_58.Start;
        (__position._M_current)->Stop = local_58.Stop;
        p_Var4[1]._M_left = (_Base_ptr)&(p_Var4[1]._M_left)->_M_left;
        return;
      }
      std::
      vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>
      ::_M_realloc_insert<BamTools::Internal::BaiAlignmentChunk_const&>
                ((vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>
                  *)&p_Var4[1]._M_parent,__position,&local_58);
      return;
    }
  }
  local_48.
  super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>
  ::_M_realloc_insert<BamTools::Internal::BaiAlignmentChunk_const&>
            ((vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>
              *)&local_48,(iterator)0x0,&local_58);
  local_30.first = *currentBin;
  std::
  vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
  ::vector(&local_30.second,&local_48);
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>>>
  ::
  _M_emplace_unique<std::pair<unsigned_int,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>>>
              *)binMap,&local_30);
  if (local_30.second.
      super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.second.
                    super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.
      super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BamStandardIndex::SaveAlignmentChunkToBin(BaiBinMap& binMap,
                                               const uint32_t& currentBin,
                                               const uint64_t& currentOffset,
                                               const uint64_t& lastOffset)
{
    // create new alignment chunk
    BaiAlignmentChunk newChunk(currentOffset, lastOffset);

    // if no entry exists yet for this bin, create one and store alignment chunk
    BaiBinMap::iterator binIter = binMap.find(currentBin);
    if ( binIter == binMap.end() ) {
        BaiAlignmentChunkVector newChunks;
        newChunks.push_back(newChunk);
        binMap.insert( pair<uint32_t, BaiAlignmentChunkVector>(currentBin, newChunks));
    }

    // otherwise, just append alignment chunk
    else {
        BaiAlignmentChunkVector& binChunks = (*binIter).second;
        binChunks.push_back( newChunk );
    }
}